

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall Diligent::GLContextState::SetStencilRef(GLContextState *this,GLenum Face,Int32 Ref)

{
  char (*in_RCX) [47];
  ulong uVar1;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  uVar1 = (ulong)(this->m_DSState).m_StencilOpState[Face != 0x404].Func;
  if (8 < uVar1) {
    FormatString<char[26],char[47]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Func < _countof(CompareFuncToGLCompareFuncMap)",in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"CompareFuncToGLCompareFunc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0xf5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  (*__glewStencilFuncSeparate)
            (Face,*(GLenum *)
                   (CompareFuncToGLCompareFunc(Diligent::COMPARISON_FUNCTION)::
                    CompareFuncToGLCompareFuncMap + uVar1 * 4),Ref,
             (this->m_DSState).m_StencilOpState[Face != 0x404].Mask);
  local_54 = glGetError();
  if (local_54 != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetStencilRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x21b,(char (*) [31])"Failed to set stencil function",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x861532);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetStencilRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x21b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GLContextState::SetStencilRef(GLenum Face, Int32 Ref)
{
    DepthStencilGLState::StencilOpState& FaceStencilOp = m_DSState.m_StencilOpState[Face == GL_FRONT ? 0 : 1];
    GLenum                               GlStencilFunc = CompareFuncToGLCompareFunc(FaceStencilOp.Func);
    glStencilFuncSeparate(Face, GlStencilFunc, Ref, FaceStencilOp.Mask);
    DEV_CHECK_GL_ERROR("Failed to set stencil function");
}